

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::ThreadPoolImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::ThreadPoolImpl> *this,ThreadPoolImpl *pObj)

{
  ThreadPoolImpl *pObj_local;
  RefCntAutoPtr<Diligent::ThreadPoolImpl> *this_local;
  
  this->m_pObject = pObj;
  if (this->m_pObject != (ThreadPoolImpl *)0x0) {
    RefCountedObject<Diligent::IThreadPool>::AddRef
              ((RefCountedObject<Diligent::IThreadPool> *)this->m_pObject);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }